

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int chacha20_setup_crypto(ptls_cipher_context_t *ctx,int is_enc,void *key)

{
  int iVar1;
  EVP_CIPHER *cipher;
  void *key_local;
  int is_enc_local;
  ptls_cipher_context_t *ctx_local;
  
  cipher = (EVP_CIPHER *)EVP_chacha20();
  iVar1 = cipher_setup_crypto(ctx,1,key,cipher,cipher_encrypt);
  return iVar1;
}

Assistant:

static int chacha20_setup_crypto(ptls_cipher_context_t *_ctx, int is_enc, const void *key)
{
    struct chacha20_context_t *ctx = (struct chacha20_context_t *)_ctx;
    ctx->super.do_dispose = chacha20_dispose;
    ctx->super.do_init = chacha20_init;
    ctx->super.do_transform = chacha20_transform;
    cf_chacha20_init(&ctx->chacha, key, PTLS_CHACHA20_KEY_SIZE, (const uint8_t *)"01234567" /* not used */);
    return 0;
}